

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result_value,
          vector<int,_std::allocator<int>_> *result_index,HVector *column,HighsInt debug_report)

{
  HighsSparseVectorSum *pHVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  long in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  HighsSparseVectorSum *in_RSI;
  HighsSparseMatrix *in_RDI;
  int in_R8D;
  HighsInt i;
  HighsInt result_num_nz;
  double multiplier_1;
  HighsInt iRow_1;
  HighsSparseVectorSum report_sum;
  HighsInt iEl_1;
  double multiplier;
  HighsInt iRow;
  HighsSparseVectorSum sum;
  HighsInt iEl;
  HighsCDouble value;
  HighsInt iCol;
  undefined4 in_stack_fffffffffffffe88;
  HighsInt in_stack_fffffffffffffe8c;
  HighsSparseVectorSum *in_stack_fffffffffffffe90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  HighsSparseVectorSum *in_stack_fffffffffffffeb0;
  value_type in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  HighsSparseVectorSum *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  HighsInt in_stack_fffffffffffffedc;
  int iVar6;
  int local_10c;
  int local_f4;
  int local_ac;
  int local_9c;
  int local_3c;
  HighsCDouble local_38;
  int local_28;
  int local_24;
  long local_20;
  vector<int,_std::allocator<int>_> *local_18;
  HighsSparseVectorSum *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (-2 < in_R8D) {
    printf("\nHighsSparseMatrix::productTranspose:\n");
  }
  bVar2 = isColwise(in_RDI);
  if (bVar2) {
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    for (local_28 = 0; local_28 < in_RDI->num_col_; local_28 = local_28 + 1) {
      HighsCDouble::HighsCDouble(&local_38,0.0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_28);
      local_3c = *pvVar4;
      while (iVar6 = local_3c,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_28 + 1)), iVar6 < *pvVar4) {
        this_00 = (vector<double,_std::allocator<double>_> *)(local_20 + 0x20);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_3c);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar4);
        std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value_,(long)local_3c);
        HighsCDouble::operator+=
                  ((HighsCDouble *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (double)in_stack_fffffffffffffe98);
        local_3c = local_3c + 1;
      }
      abs((int)&local_38);
      HighsCDouble::operator-
                ((HighsCDouble *)in_stack_fffffffffffffe90,
                 (double)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      bVar2 = HighsCDouble::operator>
                        ((HighsCDouble *)in_stack_fffffffffffffe90,
                         (double)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (bVar2) {
        HighsCDouble::operator_cast_to_double(&local_38);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (value_type_conflict2 *)in_stack_fffffffffffffe98);
      }
    }
  }
  else {
    HighsSparseVectorSum::HighsSparseVectorSum
              (in_stack_fffffffffffffeb0,(HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    for (local_9c = 0; local_9c < in_RDI->num_row_; local_9c = local_9c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                          (long)local_9c);
      pHVar1 = (HighsSparseVectorSum *)*pvVar3;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_9c);
      local_ac = *pvVar4;
      while (in_stack_fffffffffffffebc = local_ac,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_9c + 1)),
            in_stack_fffffffffffffebc < *pvVar4) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_ac);
        in_stack_fffffffffffffeb8 = *pvVar4;
        in_stack_fffffffffffffeb0 = pHVar1;
        std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value_,(long)local_ac);
        HighsSparseVectorSum::add
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                   (double)in_stack_fffffffffffffeb0);
        local_ac = local_ac + 1;
      }
    }
    if (-2 < local_24) {
      HighsSparseVectorSum::HighsSparseVectorSum
                (in_stack_fffffffffffffeb0,(HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      for (local_f4 = 0; local_f4 < in_RDI->num_row_; local_f4 = local_f4 + 1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),(long)local_f4);
        if ((local_24 == -1) || (local_24 == local_f4)) {
          in_stack_fffffffffffffea4 = local_f4;
          std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)(local_f4 + 1));
          debugReportRowPrice(in_RDI,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                              (HighsInt)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                              in_stack_fffffffffffffec0);
        }
      }
      HighsSparseVectorSum::~HighsSparseVectorSum(in_stack_fffffffffffffe90);
    }
    HighsSparseVectorSum::
    cleanup<HighsSparseMatrix::productTransposeQuad(std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,HVectorBase<double>const&,int)const::__0>
              (in_stack_fffffffffffffec0,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(local_18);
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    for (local_10c = 0; local_10c < (int)sVar5; local_10c = local_10c + 1) {
      in_stack_fffffffffffffe90 = local_10;
      std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_10c);
      HighsSparseVectorSum::getValue(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    HighsSparseVectorSum::~HighsSparseVectorSum(in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result_value, vector<HighsInt>& result_index,
    const HVector& column, const HighsInt debug_report) const {
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::productTranspose:\n");
  if (this->isColwise()) {
    result_value.reserve(this->num_col_);
    result_index.reserve(this->num_col_);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];

      if (abs(value) - kHighsTiny > 0.0) {
        result_value.push_back(double(value));
        result_index.push_back(iCol);
      }
    }
  } else {
    HighsSparseVectorSum sum(num_col_);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      double multiplier = column.array[iRow];
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
    }
    if (debug_report >= kDebugReportAll) {
      HighsSparseVectorSum report_sum(num_col_);
      for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
        double multiplier = column.array[iRow];
        if (debug_report == kDebugReportAll || debug_report == iRow)
          debugReportRowPrice(iRow, multiplier, this->start_[iRow + 1],
                              report_sum);
      }
    }

    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
    result_index = std::move(sum.nonzeroinds);
    HighsInt result_num_nz = result_index.size();
    result_value.reserve(result_num_nz);
    for (HighsInt i = 0; i < result_num_nz; ++i)
      result_value.push_back(sum.getValue(result_index[i]));
  }
}